

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>::updateIndexedViews
          (ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *this)

{
  bool bVar1;
  reference input;
  element_type *peVar2;
  __shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RDI;
  vector<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
  expandData;
  AttributeBuffer *viewBuffer;
  ManagedBuffer<unsigned_int> *indices;
  shared_ptr<polyscope::render::AttributeBuffer> viewBufferPtr;
  tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
  *existingViewTup;
  iterator __end2;
  iterator __begin2;
  vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
  *__range2;
  vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
  *in_stack_ffffffffffffff78;
  weak_ptr<polyscope::render::AttributeBuffer> *in_stack_ffffffffffffff88;
  vector<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
  *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  __shared_ptr local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffd0;
  __normal_iterator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_*,_std::vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>_>
  local_18;
  __shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_10;
  
  checkDeviceBufferTypeIs
            ((ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *)indices,
             viewBuffer._4_4_);
  removeDeletedIndexedViews
            ((ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  local_10 = in_RDI + 0xa0;
  local_18._M_current =
       (tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
        *)std::
          vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
          ::begin(in_stack_ffffffffffffff78);
  std::
  vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
  ::end(in_stack_ffffffffffffff78);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_*,_std::vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>_>
                             *)in_RDI,
                            (__normal_iterator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_*,_std::vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>_>
                             *)in_stack_ffffffffffffff78), bVar1) {
    input = __gnu_cxx::
            __normal_iterator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_*,_std::vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>_>
            ::operator*(&local_18);
    std::
    get<1ul,polyscope::render::ManagedBuffer<unsigned_int>*,std::weak_ptr<polyscope::render::AttributeBuffer>>
              ((tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
                *)0x42ca5c);
    std::weak_ptr<polyscope::render::AttributeBuffer>::lock(in_stack_ffffffffffffff88);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_38);
    if (bVar1) {
      std::
      get<0ul,polyscope::render::ManagedBuffer<unsigned_int>*,std::weak_ptr<polyscope::render::AttributeBuffer>>
                ((tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
                  *)0x42ca8b);
      peVar2 = std::
               __shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(in_RDI);
      ManagedBuffer<unsigned_int>::ensureHostBufferPopulated(indices);
      gather<glm::vec<3,unsigned_int,(glm::qualifier)0>>
                ((vector<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
                  *)input,in_stack_ffffffffffffffd0);
      (*peVar2->_vptr_AttributeBuffer[10])(peVar2,&stack0xffffffffffffff88);
      std::
      vector<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
      ::~vector(in_stack_ffffffffffffff90);
    }
    std::shared_ptr<polyscope::render::AttributeBuffer>::~shared_ptr
              ((shared_ptr<polyscope::render::AttributeBuffer> *)0x42cafd);
    __gnu_cxx::
    __normal_iterator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_*,_std::vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>_>
    ::operator++(&local_18);
  }
  requestRedraw();
  return;
}

Assistant:

void ManagedBuffer<T>::updateIndexedViews() {
  checkDeviceBufferTypeIs(DeviceBufferType::Attribute);

  removeDeletedIndexedViews(); // periodic filtering

  for (std::tuple<render::ManagedBuffer<uint32_t>*, std::weak_ptr<render::AttributeBuffer>>& existingViewTup :
       existingIndexedViews) {

    std::shared_ptr<render::AttributeBuffer> viewBufferPtr = std::get<1>(existingViewTup).lock();
    if (!viewBufferPtr) continue; // skip if it has been deleted (will be removed eventually)

    // note: index buffer must still be alive here. we can't check it, you will just get memory errors
    // if it has been deleted
    render::ManagedBuffer<uint32_t>& indices = *std::get<0>(existingViewTup);
    render::AttributeBuffer& viewBuffer = *viewBufferPtr;

    // apply the indexing and set the data
    indices.ensureHostBufferPopulated();
    std::vector<T> expandData = gather(data, indices.data);
    viewBuffer.setData(expandData);

    // TODO fornow, only CPU-side updating is supported. Add direct GPU-side support using the bufferIndexCopyProgram
    // below.
  }

  requestRedraw();
}